

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

Element __thiscall wasm::RandomLattice::getBottom(RandomLattice *this)

{
  long lVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  long in_RSI;
  Element EVar3;
  
  lVar1 = (long)*(char *)(*(long *)(in_RSI + 8) + 0x28);
  if (lVar1 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<wasm::RandomElement<wasm::RandomLattice>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:944:5)_&&,_const_std::variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>_&>
      ::_S_vtable._M_arr[lVar1]._M_data)
              ((anon_class_1_0_00000001 *)this,
               (variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                *)&stack0xffffffffffffffef);
    EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = extraout_RDX._M_head_impl;
    EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
    super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
    return (Element)EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_001ed3e8;
  puVar2[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

RandomLattice::Element RandomLattice::getBottom() const noexcept {
  return std::visit(
    [](const auto& l) -> Element { return ElementImpl{l.getBottom()}; },
    (const LatticeVariant&)*lattice);
}